

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::PageViewPrivate(PageViewPrivate *this,PageView *parent)

{
  PageView *parent_local;
  PageViewPrivate *this_local;
  
  this->q = parent;
  this->viewport = (QWidget *)0x0;
  this->control = (PageControl *)0x0;
  this->showPageControl = true;
  QList<QWidget_*>::QList(&this->pages);
  this->controlOffset = 0;
  this->leftButtonPressed = false;
  QPoint::QPoint(&this->pos);
  this->pagesPrepared = false;
  this->pagesOffset = 0;
  this->normalizeAnimation = (QVariantAnimation *)0x0;
  this->indexAfterNormalizeAnimation = -1;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

PageViewPrivate( PageView * parent )
		:	q( parent )
		,	viewport( 0 )
		,	control( 0 )
		,	showPageControl( true )
		,	controlOffset( 0 )
		,	leftButtonPressed( false )
		,	pagesPrepared( false )
		,	pagesOffset( 0 )
		,	normalizeAnimation( 0 )
		,	indexAfterNormalizeAnimation( -1 )
	{
		init();
	}